

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int ON_StringLengthUTF8(char *string,size_t string_capacity)

{
  char *pcVar1;
  int iVar2;
  char *string1;
  
  iVar2 = (int)string;
  if ((string_capacity != 0 && string != (char *)0x0) && (0 < (long)string_capacity)) {
    pcVar1 = string + string_capacity;
    do {
      if (*string == '\0') break;
      string = string + 1;
    } while (string < pcVar1);
  }
  return (int)string - iVar2;
}

Assistant:

int ON_StringLengthUTF8(
  const char* string,
  size_t string_capacity
  )
{
  const char* string1 = string;
  if (nullptr != string1 && string_capacity > 0 )
  {
    for (const char* end = string1 + string_capacity; string1 < end; string1++)
    {
      if ( 0 == *string1)
        break;
    }
  }
  return (int)(string1 - string);
}